

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<void> __thiscall kj::anon_unknown_30::AsyncStreamFd::waitConnected(AsyncStreamFd *this)

{
  int osErrorNumber;
  void *pvVar1;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar3;
  Fault local_40;
  Fault f;
  SyscallResult local_28;
  undefined1 local_24 [4];
  SyscallResult _kjSyscallResult;
  int pollResult;
  pollfd pollfd;
  AsyncStreamFd *this_local;
  PromiseNode *pPVar2;
  
  memset(&_kjSyscallResult,0,8);
  _kjSyscallResult.errorNumber = *(int *)(in_RSI + 0x10);
  f.exception = (Exception *)local_24;
  local_28 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::AsyncStreamFd::waitConnected()::_lambda()_1_>
                       ((anon_class_16_2_cb93cd9a *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_28);
  if (pvVar1 != (void *)0x0) {
    if (local_24 == (undefined1  [4])0x0) {
      PVar3 = UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)this);
      pPVar2 = PVar3.super_PromiseBase.node.ptr;
    }
    else {
      Promise<void>::Promise((Promise<void> *)this);
      pPVar2 = extraout_RDX;
    }
    PVar3.super_PromiseBase.node.ptr = pPVar2;
    PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar3.super_PromiseBase.node;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_28);
  kj::_::Debug::Fault::Fault
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x122,osErrorNumber,"pollResult = poll(&pollfd, 1, 0)","");
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

Promise<void> waitConnected() {
    // Wait until initial connection has completed. This actually just waits until it is writable.

    // Can't just go directly to writeObserver.whenBecomesWritable() because of edge triggering. We
    // need to explicitly check if the socket is already connected.

    struct pollfd pollfd;
    memset(&pollfd, 0, sizeof(pollfd));
    pollfd.fd = fd;
    pollfd.events = POLLOUT;

    int pollResult;
    KJ_SYSCALL(pollResult = poll(&pollfd, 1, 0));

    if (pollResult == 0) {
      // Not ready yet. We can safely use the edge-triggered observer.
      return observer.whenBecomesWritable();
    } else {
      // Ready now.
      return kj::READY_NOW;
    }
  }